

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O2

Remotes * Omega_h::push_elem_uses
                    (Remotes *__return_storage_ptr__,RemoteGraph *own_verts2own_elems,
                    Dist *own_verts2verts)

{
  ulong uVar1;
  long lVar2;
  Remotes *__return_storage_ptr___00;
  uint uVar3;
  int iVar4;
  LO nrroots;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  Write<int> vert_idxs;
  Write<int> vert_ranks;
  Write<int> elem_idxs;
  Write<int> elem_ranks;
  LOs own_verts2items;
  LOs own_verts2serv_verts;
  LOs own_verts2serv_uses;
  Dist verts2own_verts;
  long local_340;
  Write<int> local_338;
  Remotes *local_328;
  Dist *local_320;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_318;
  ulong local_310;
  ulong local_308;
  Write<int> local_300;
  Write<int> local_2f0;
  Write<int> local_2e0;
  Write<int> local_2d0;
  undefined1 local_2c0 [112];
  Dist items2verts;
  Write<int> local_1b0;
  Remotes local_1a0;
  Remotes items2own_elems;
  Remotes local_160;
  Remotes items2verts_map;
  Remotes serv_verts2verts;
  Remotes serv_uses2own_elems;
  type f;
  
  Write<int>::Write(&own_verts2serv_uses.write_,(Write<int> *)own_verts2own_elems);
  Remotes::Remotes(&serv_uses2own_elems,&own_verts2own_elems->edges2remotes);
  uVar3 = Dist::nroots(own_verts2verts);
  Dist::roots2items((Dist *)&own_verts2serv_verts);
  Write<int>::Write((Write<int> *)(local_2c0 + 0x60),&own_verts2serv_uses.write_);
  Write<int>::Write((Write<int> *)(local_2c0 + 0x50),&own_verts2serv_verts.write_);
  multiply_fans((Omega_h *)&own_verts2items,(LOs *)(local_2c0 + 0x60),(LOs *)(local_2c0 + 0x50));
  Write<int>::~Write((Write<int> *)(local_2c0 + 0x50));
  Write<int>::~Write((Write<int> *)(local_2c0 + 0x60));
  iVar4 = Read<int>::last((Read<signed_char> *)&own_verts2items);
  Dist::items2dests(&serv_verts2verts,own_verts2verts);
  std::__cxx11::string::string((string *)&verts2own_verts,"",(allocator *)&items2verts);
  Write<int>::Write(&elem_ranks,iVar4,(string *)&verts2own_verts);
  std::__cxx11::string::~string((string *)&verts2own_verts);
  std::__cxx11::string::string((string *)&verts2own_verts,"",(allocator *)&items2verts);
  Write<int>::Write(&elem_idxs,iVar4,(string *)&verts2own_verts);
  std::__cxx11::string::~string((string *)&verts2own_verts);
  std::__cxx11::string::string((string *)&verts2own_verts,"",(allocator *)&items2verts);
  Write<int>::Write(&vert_ranks,iVar4,(string *)&verts2own_verts);
  std::__cxx11::string::~string((string *)&verts2own_verts);
  std::__cxx11::string::string((string *)&verts2own_verts,"",(allocator *)&items2verts);
  Write<int>::Write(&vert_idxs,iVar4,(string *)&verts2own_verts);
  std::__cxx11::string::~string((string *)&verts2own_verts);
  Write<int>::Write((Write<int> *)&f,&own_verts2items.write_);
  Write<int>::Write(&f.own_verts2serv_verts.write_,&own_verts2serv_verts.write_);
  Write<int>::Write(&f.own_verts2serv_uses.write_,&own_verts2serv_uses.write_);
  Write<int>::Write(&f.elem_ranks,&elem_ranks);
  Remotes::Remotes(&f.serv_uses2own_elems,&serv_uses2own_elems);
  Write<int>::Write(&f.elem_idxs,&elem_idxs);
  local_328 = __return_storage_ptr__;
  local_320 = own_verts2verts;
  Write<int>::Write(&f.vert_ranks,&vert_ranks);
  Remotes::Remotes(&f.serv_verts2verts,&serv_verts2verts);
  Write<int>::Write(&f.vert_idxs,&vert_idxs);
  Write<int>::Write((Write<int> *)&items2verts,(Write<int> *)&f);
  Write<int>::Write(&items2verts.roots2items_[0].write_,&f.own_verts2serv_verts.write_);
  Write<int>::Write(&items2verts.roots2items_[1].write_,&f.own_verts2serv_uses.write_);
  Write<int>::Write(&items2verts.items2content_[0].write_,&f.elem_ranks);
  Remotes::Remotes((Remotes *)(items2verts.items2content_ + 1),&f.serv_uses2own_elems);
  Write<int>::Write(&items2verts.msgs2content_[1].write_,&f.elem_idxs);
  Write<int>::Write((Write<int> *)items2verts.comm_,&f.vert_ranks);
  Remotes::Remotes((Remotes *)(items2verts.comm_ + 1),&f.serv_verts2verts);
  Write<int>::Write(&local_1b0,&f.vert_idxs);
  if (0 < (int)uVar3) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)&verts2own_verts,(Write<int> *)&items2verts);
    Write<int>::Write(&verts2own_verts.roots2items_[0].write_,&items2verts.roots2items_[0].write_);
    Write<int>::Write(&verts2own_verts.roots2items_[1].write_,&items2verts.roots2items_[1].write_);
    Write<int>::Write(&verts2own_verts.items2content_[0].write_,
                      &items2verts.items2content_[0].write_);
    Remotes::Remotes((Remotes *)(verts2own_verts.items2content_ + 1),
                     (Remotes *)(items2verts.items2content_ + 1));
    Write<int>::Write(&verts2own_verts.msgs2content_[1].write_,&items2verts.msgs2content_[1].write_)
    ;
    Write<int>::Write((Write<int> *)verts2own_verts.comm_,(Write<int> *)items2verts.comm_);
    Remotes::Remotes((Remotes *)(verts2own_verts.comm_ + 1),(Remotes *)(items2verts.comm_ + 1));
    Write<int>::Write(&local_338,&local_1b0);
    entering_parallel = 0;
    local_310 = (ulong)uVar3;
    local_318 = verts2own_verts.parent_comm_.
                super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    uVar1 = 0;
    while (uVar5 = uVar1, uVar5 != local_310) {
      iVar4 = *(int *)((long)&(verts2own_verts.parent_comm_.
                               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5 * 4);
      uVar1 = uVar5 + 1;
      for (lVar7 = (long)*(int *)((long)verts2own_verts.roots2items_[0].write_.shared_alloc_.
                                        direct_ptr + uVar5 * 4);
          lVar7 < *(int *)((long)verts2own_verts.roots2items_[0].write_.shared_alloc_.direct_ptr +
                          uVar1 * 4); lVar7 = lVar7 + 1) {
        lVar8 = (long)*(int *)((long)verts2own_verts.roots2items_[1].write_.shared_alloc_.direct_ptr
                              + uVar5 * 4);
        lVar2 = lVar8 * 4;
        lVar9 = (long)iVar4 * 4;
        for (lVar6 = 0;
            lVar8 + lVar6 <
            (long)*(int *)((long)verts2own_verts.roots2items_[1].write_.shared_alloc_.direct_ptr +
                          uVar1 * 4); lVar6 = lVar6 + 1) {
          *(undefined4 *)
           ((long)verts2own_verts.items2content_[0].write_.shared_alloc_.direct_ptr +
           lVar6 * 4 + lVar9) =
               *(undefined4 *)
                ((long)verts2own_verts.items2content_[1].write_.shared_alloc_.direct_ptr +
                lVar6 * 4 + lVar2);
          *(undefined4 *)
           ((long)verts2own_verts.msgs2content_[1].write_.shared_alloc_.direct_ptr +
           lVar6 * 4 + lVar9) =
               *(undefined4 *)
                ((long)verts2own_verts.msgs2content_[0].write_.shared_alloc_.direct_ptr +
                lVar6 * 4 + lVar2);
          *(undefined4 *)
           ((long)&(verts2own_verts.comm_[0].
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                   ->_vptr__Sp_counted_base + lVar6 * 4 + lVar9) =
               *(undefined4 *)
                ((long)&(verts2own_verts.comm_[1].
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_vptr__Sp_counted_base + lVar7 * 4);
          *(undefined4 *)((long)local_338.shared_alloc_.direct_ptr + lVar6 * 4 + lVar9) =
               *(undefined4 *)(local_340 + lVar7 * 4);
        }
        iVar4 = iVar4 + (int)lVar6;
      }
      local_308 = uVar5;
      if (iVar4 != *(int *)((long)&(verts2own_verts.parent_comm_.
                                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5 * 4 + 4)) {
        fail("assertion %s failed at %s +%d\n","item == own_verts2items[ov + 1]",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_ghost.cpp"
             ,0x45);
      }
    }
    push_elem_uses(Omega_h::RemoteGraph,Omega_h::Dist)::$_0::~__0((__0 *)&verts2own_verts);
  }
  push_elem_uses(Omega_h::RemoteGraph,Omega_h::Dist)::$_0::~__0((__0 *)&items2verts);
  Dist::invert(&verts2own_verts,local_320);
  nrroots = Dist::nitems(&verts2own_verts);
  __return_storage_ptr___00 = local_328;
  Write<int>::Write((Write<int> *)(local_2c0 + 0x30),&vert_ranks);
  Read<int>::Read((Read<signed_char> *)(local_2c0 + 0x40),(Write<int> *)(local_2c0 + 0x30));
  Write<int>::Write((Write<int> *)(local_2c0 + 0x10),&vert_idxs);
  Read<int>::Read((Read<signed_char> *)(local_2c0 + 0x20),(Write<int> *)(local_2c0 + 0x10));
  Remotes::Remotes(&items2verts_map,(Read<int> *)(local_2c0 + 0x40),(LOs *)(local_2c0 + 0x20));
  Write<int>::~Write((Write<int> *)(local_2c0 + 0x20));
  Write<int>::~Write((Write<int> *)(local_2c0 + 0x10));
  Write<int>::~Write((Write<int> *)(local_2c0 + 0x40));
  Write<int>::~Write((Write<int> *)(local_2c0 + 0x30));
  Dist::parent_comm((Dist *)local_2c0);
  Remotes::Remotes(&local_160,&items2verts_map);
  Dist::Dist(&items2verts,(CommPtr *)local_2c0,&local_160,nrroots);
  Remotes::~Remotes(&local_160);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2c0 + 8));
  Write<int>::Write(&local_2e0,&elem_ranks);
  Read<int>::Read((Read<signed_char> *)&local_2d0,&local_2e0);
  Write<int>::Write(&local_300,&elem_idxs);
  Read<int>::Read((Read<signed_char> *)&local_2f0,&local_300);
  Remotes::Remotes(&items2own_elems,(Read<int> *)&local_2d0,(LOs *)&local_2f0);
  Write<int>::~Write(&local_2f0);
  Write<int>::~Write(&local_300);
  Write<int>::~Write(&local_2d0);
  Write<int>::~Write(&local_2e0);
  Remotes::Remotes(&local_1a0,&items2own_elems);
  Dist::exch(__return_storage_ptr___00,&items2verts,&local_1a0,1);
  Remotes::~Remotes(&local_1a0);
  Remotes::~Remotes(&items2own_elems);
  Dist::~Dist(&items2verts);
  Remotes::~Remotes(&items2verts_map);
  Dist::~Dist(&verts2own_verts);
  push_elem_uses(Omega_h::RemoteGraph,Omega_h::Dist)::$_0::~__0((__0 *)&f);
  Write<int>::~Write(&vert_idxs);
  Write<int>::~Write(&vert_ranks);
  Write<int>::~Write(&elem_idxs);
  Write<int>::~Write(&elem_ranks);
  Remotes::~Remotes(&serv_verts2verts);
  Write<int>::~Write(&own_verts2items.write_);
  Write<int>::~Write(&own_verts2serv_verts.write_);
  Remotes::~Remotes(&serv_uses2own_elems);
  Write<int>::~Write(&own_verts2serv_uses.write_);
  return __return_storage_ptr___00;
}

Assistant:

Remotes push_elem_uses(RemoteGraph own_verts2own_elems, Dist own_verts2verts) {
  auto own_verts2serv_uses = own_verts2own_elems.locals2edges;
  auto serv_uses2own_elems = own_verts2own_elems.edges2remotes;
  auto nown_verts = own_verts2verts.nroots();
  auto own_verts2serv_verts = own_verts2verts.roots2items();
  auto own_verts2items =
      multiply_fans(own_verts2serv_uses, own_verts2serv_verts);
  auto nitems = own_verts2items.last();
  auto serv_verts2verts = own_verts2verts.items2dests();
  Write<I32> elem_ranks(nitems);
  Write<LO> elem_idxs(nitems);
  Write<I32> vert_ranks(nitems);
  Write<LO> vert_idxs(nitems);
  auto f = OMEGA_H_LAMBDA(LO ov) {
    auto item = own_verts2items[ov];
    for (auto sv = own_verts2serv_verts[ov]; sv < own_verts2serv_verts[ov + 1];
         ++sv) {
      for (auto su = own_verts2serv_uses[ov]; su < own_verts2serv_uses[ov + 1];
           ++su) {
        elem_ranks[item] = serv_uses2own_elems.ranks[su];
        elem_idxs[item] = serv_uses2own_elems.idxs[su];
        vert_ranks[item] = serv_verts2verts.ranks[sv];
        vert_idxs[item] = serv_verts2verts.idxs[sv];
        ++item;
      }
    }
    OMEGA_H_CHECK(item == own_verts2items[ov + 1]);
  };
  parallel_for(nown_verts, f, "push_elem_uses");
  auto verts2own_verts = own_verts2verts.invert();
  auto nverts = verts2own_verts.nitems();
  auto items2verts_map = Remotes(Read<I32>(vert_ranks), LOs(vert_idxs));
  Dist items2verts(own_verts2verts.parent_comm(), items2verts_map, nverts);
  auto items2own_elems = Remotes(Read<I32>(elem_ranks), LOs(elem_idxs));
  return items2verts.exch(items2own_elems, 1);
}